

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsyncLogging.cc
# Opt level: O0

void __thiscall tt::AsyncLogging::append(AsyncLogging *this,char *logline,int len)

{
  bool bVar1;
  int iVar2;
  element_type *peVar3;
  FixedBuffer<4000000> *this_00;
  MutexLockGuard local_28;
  MutexLockGuard lock;
  int len_local;
  char *logline_local;
  AsyncLogging *this_local;
  
  lock.m_mutex._4_4_ = len;
  MutexLockGuard::MutexLockGuard(&local_28,&this->m_mutex);
  peVar3 = std::
           __shared_ptr_access<tt::detail::FixedBuffer<4000000>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<tt::detail::FixedBuffer<4000000>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->m_currentBuffer);
  iVar2 = detail::FixedBuffer<4000000>::avail(peVar3);
  if (lock.m_mutex._4_4_ < iVar2) {
    peVar3 = std::
             __shared_ptr_access<tt::detail::FixedBuffer<4000000>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<tt::detail::FixedBuffer<4000000>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&this->m_currentBuffer);
    detail::FixedBuffer<4000000>::append(peVar3,logline,(long)lock.m_mutex._4_4_);
  }
  else {
    std::
    vector<std::shared_ptr<tt::detail::FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<tt::detail::FixedBuffer<4000000>_>_>_>
    ::push_back(&this->m_buffers,&this->m_currentBuffer);
    bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&this->m_nextBuffer);
    if (bVar1) {
      std::shared_ptr<tt::detail::FixedBuffer<4000000>_>::operator=
                (&this->m_currentBuffer,&this->m_nextBuffer);
    }
    else {
      this_00 = (FixedBuffer<4000000> *)operator_new(0x3d0908);
      detail::FixedBuffer<4000000>::FixedBuffer(this_00);
      std::__shared_ptr<tt::detail::FixedBuffer<4000000>,(__gnu_cxx::_Lock_policy)2>::
      reset<tt::detail::FixedBuffer<4000000>>
                ((__shared_ptr<tt::detail::FixedBuffer<4000000>,(__gnu_cxx::_Lock_policy)2> *)
                 &this->m_currentBuffer,this_00);
    }
    peVar3 = std::
             __shared_ptr_access<tt::detail::FixedBuffer<4000000>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<tt::detail::FixedBuffer<4000000>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&this->m_currentBuffer);
    detail::FixedBuffer<4000000>::append(peVar3,logline,(long)lock.m_mutex._4_4_);
    Condition::notify(&this->m_cond);
  }
  MutexLockGuard::~MutexLockGuard(&local_28);
  return;
}

Assistant:

void AsyncLogging::append(const char* logline, int len){
	tt::MutexLockGuard lock(m_mutex);


	//如果当前缓冲区剩余空间足够大(可以容纳下当前日志的大小)
	
	if(m_currentBuffer->avail() > len){
		m_currentBuffer->append(logline,len);
	}else{
		m_buffers.push_back(std::move(m_currentBuffer));

		if(m_nextBuffer){
			m_currentBuffer = std::move(m_nextBuffer);
		}else{
			m_currentBuffer.reset(new Buffer);
		}

		m_currentBuffer->append(logline,len);
		m_cond.notify();
	}
	
}